

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.hpp
# Opt level: O0

bool checkSerializeAndUnserialize<packet::PacketT<packet::DefaultConfig>>(string *packetContent)

{
  __type _Var1;
  Status SVar2;
  ostream *poVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  byte_t *pbVar4;
  size_t sVar5;
  bool bVar6;
  PacketT<packet::DefaultConfig> p;
  string serialized;
  string *in_stack_00000128;
  PacketT<packet::DefaultConfig> *in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  allocator local_b1;
  string local_b0 [32];
  PacketT<packet::DefaultConfig> local_90;
  string local_30 [47];
  byte local_1;
  
  serializePacketFromData<packet::PacketT<packet::DefaultConfig>>(in_stack_00000128);
  poVar3 = std::operator<<((ostream *)&std::cout,"Serialized data: ");
  poVar3 = std::operator<<(poVar3,local_30);
  std::operator<<(poVar3,"\n");
  readPacket<packet::PacketT<packet::DefaultConfig>>
            ((string *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  poVar3 = std::operator<<((ostream *)&std::cout,"packet status: ");
  SVar2 = packet::PacketT<packet::DefaultConfig>::status(&local_90);
  __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          std::ostream::operator<<((ostream *)poVar3,SVar2);
  std::operator<<((ostream *)__lhs,"\n");
  SVar2 = packet::PacketT<packet::DefaultConfig>::status(&local_90);
  bVar6 = SVar2 == COMPLETE;
  in_stack_ffffffffffffff18 = in_stack_ffffffffffffff18 & 0xffffff;
  if (bVar6) {
    pbVar4 = packet::PacketT<packet::DefaultConfig>::data(in_stack_ffffffffffffff10);
    sVar5 = packet::PacketT<packet::DefaultConfig>::dataLen(&local_90);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b0,(char *)pbVar4,sVar5,&local_b1);
    _Var1 = std::operator==(__lhs,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)CONCAT44(SVar2,in_stack_ffffffffffffff18));
    in_stack_ffffffffffffff18 = (uint)_Var1 << 0x18;
  }
  local_1 = (byte)(in_stack_ffffffffffffff18 >> 0x18);
  if (bVar6) {
    std::__cxx11::string::~string(local_b0);
    std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  }
  packet::PacketT<packet::DefaultConfig>::~PacketT((PacketT<packet::DefaultConfig> *)0x107b42);
  std::__cxx11::string::~string(local_30);
  return (bool)(local_1 & 1);
}

Assistant:

static bool
checkSerializeAndUnserialize(const std::string& packetContent)
{
    const std::string serialized = serializePacketFromData<PacketType>(packetContent);
    std::cout << "Serialized data: " << serialized << "\n";

    const PacketType p = readPacket<PacketType>(serialized);
    std::cout << "packet status: " << int(p.status()) << "\n";
    return (p.status() == packet::Status::COMPLETE) &&
           std::string((const char*)p.data(), p.dataLen()) == packetContent;
}